

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall OpenMD::NegativeConstraint::NegativeConstraint(NegativeConstraint *this)

{
  string *in_RDI;
  
  ParamConstraintFacade<OpenMD::NegativeConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::NegativeConstraint> *)0x252358);
  std::__cxx11::string::operator=(in_RDI,"negative");
  return;
}

Assistant:

NegativeConstraint() { this->description_ = "negative"; }